

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O3

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  pointer *pppaVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  iterator __position;
  arg_info *paVar5;
  arg_info *paVar6;
  arg_info *paVar7;
  bool bVar8;
  arg_info *h;
  arg_info *local_28;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  local_28 = (arg_info *)malloc((long)(iVar4 * iVar3));
  paVar7 = (arg_info *)((long)&local_28->addr + (long)((iVar3 + -1) * iVar4));
  paVar5 = local_28;
  do {
    paVar6 = (arg_info *)((long)&paVar5->addr + (long)iVar4);
    paVar5->array_range = (array_range_t *)0x0;
    paVar5->next = (arg_info *)0x0;
    paVar5->addr = 0;
    paVar5->size = 0;
    paVar5->wr = false;
    paVar5->rank = '\0';
    *(undefined6 *)&paVar5->field_0x22 = 0;
    paVar5->next = paVar6;
    paVar5 = paVar6;
  } while (paVar6 <= paVar7);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  __position._M_current =
       (this->v_).
       super__Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->v_).
      super__Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<depspawn::internal::arg_info*,std::allocator<depspawn::internal::arg_info*>>::
    _M_realloc_insert<depspawn::internal::arg_info*const&>
              ((vector<depspawn::internal::arg_info*,std::allocator<depspawn::internal::arg_info*>>
                *)this,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppaVar1 = &(this->v_).
                super__Vector_base<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  paVar5 = (this->head_)._M_b._M_p;
  do {
    paVar7->next = paVar5;
    LOCK();
    paVar6 = (this->head_)._M_b._M_p;
    bVar8 = paVar5 == paVar6;
    if (bVar8) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)paVar5 & 0xffff000000000000) + 0x1000000000000 | (ulong)local_28);
      paVar6 = paVar5;
    }
    UNLOCK();
    paVar5 = paVar6;
  } while (!bVar8);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }